

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

menu_skin_conflict * menu_find_skin(skin_id id)

{
  menu_skin_conflict *pmStack_10;
  skin_id id_local;
  
  if (id == MN_SKIN_SCROLL) {
    pmStack_10 = &menu_skin_scroll;
  }
  else if (id == MN_SKIN_OBJECT) {
    pmStack_10 = &menu_skin_object;
  }
  else if (id == MN_SKIN_COLUMNS) {
    pmStack_10 = &menu_skin_column;
  }
  else {
    pmStack_10 = (menu_skin_conflict *)0x0;
  }
  return pmStack_10;
}

Assistant:

static const menu_skin *menu_find_skin(skin_id id)
{
	switch (id)
	{
		case MN_SKIN_SCROLL:
			return &menu_skin_scroll;

		case MN_SKIN_OBJECT:
			return &menu_skin_object;

		case MN_SKIN_COLUMNS:
			return &menu_skin_column;
	}

	return NULL;
}